

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcEquipmentStandard::IfcEquipmentStandard(IfcEquipmentStandard *this)

{
  *(undefined ***)&(this->super_IfcControl).field_0xf0 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0xf8 = 0;
  *(char **)&this->field_0x100 = "IfcEquipmentStandard";
  IfcControl::IfcControl(&this->super_IfcControl,&PTR_construction_vtable_24__00888cd8);
  *(undefined8 *)&(this->super_IfcControl).super_IfcObject = 0x888bf8;
  *(undefined8 *)&(this->super_IfcControl).field_0xf0 = 0x888cc0;
  *(undefined8 *)&(this->super_IfcControl).super_IfcObject.field_0x88 = 0x888c20;
  (this->super_IfcControl).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x888c48;
  *(undefined8 *)&(this->super_IfcControl).super_IfcObject.field_0xd0 = 0x888c70;
  *(undefined8 *)&(this->super_IfcControl).super_IfcObject.field_0xe0 = 0x888c98;
  return;
}

Assistant:

IfcEquipmentStandard() : Object("IfcEquipmentStandard") {}